

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O2

void symmetric_nic_tcp_main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  epoll_event *__events;
  int64_t iVar5;
  tcp_connection *ptVar6;
  request *prVar7;
  ssize_t sVar8;
  int *piVar9;
  long lVar10;
  ssize_t sVar11;
  long lVar12;
  int64_t iVar13;
  ulong uVar14;
  timestamp_info *unaff_RBP;
  ulong uVar15;
  char *__s;
  uint32_t uVar16;
  uint64_t uVar17;
  uint32_t bytes;
  long lVar18;
  long in_FS_OFFSET;
  byte_req_pair bVar19;
  timespec latency;
  msghdr hdr;
  timestamp_info rx_timestamp;
  char hostname [64];
  
  iVar1 = throughput_open_connections();
  if (iVar1 != 0) {
    return;
  }
  iVar1 = get_conn_count();
  iVar2 = get_thread_count();
  __events = (epoll_event *)malloc((long)(iVar1 / iVar2) * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar5 = time_ns();
  do {
    do {
      lVar18 = iVar5;
      iVar3 = should_load();
      iVar5 = time_ns();
    } while (iVar3 == 0);
    if ((lVar18 <= iVar5) && (ptVar6 = pick_conn(), ptVar6 != (tcp_connection *)0x0)) {
      prVar7 = prepare_request();
      hdr.msg_iov = prVar7->iovs;
      uVar15 = 0;
      uVar14 = (ulong)(uint)prVar7->iov_cnt;
      if (prVar7->iov_cnt < 1) {
        uVar14 = uVar15;
      }
      bytes = 0;
      for (; uVar14 * 0x10 != uVar15; uVar15 = uVar15 + 0x10) {
        bytes = bytes + *(int *)((long)&prVar7->iovs[0].iov_len + uVar15);
      }
      hdr.msg_control = (void *)0x0;
      hdr.msg_controllen = 0;
      hdr.msg_name = (void *)0x0;
      hdr.msg_namelen = 0;
      hdr._12_4_ = 0;
      hdr.msg_flags = 0;
      hdr._52_4_ = 0;
      hdr.msg_iovlen = (size_t)prVar7->iov_cnt;
      sVar8 = sendmsg(ptVar6->fd,(msghdr *)&hdr,0);
      uVar16 = (uint32_t)sVar8;
      if (((int)uVar16 < 0) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
        gethostname(hostname,0x40);
        fprintf(_stderr,"[%s] ",hostname);
        __s = "Unknown connection error write\n";
LAB_001088ca:
        perror(__s);
        return;
      }
      if (bytes != uVar16) {
        __assert_fail("ret == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x1d0,"void symmetric_nic_tcp_main(void)");
      }
      add_pending_tx_timestamp
                ((pending_tx_timestamps *)
                 ((ulong)ptVar6->idx * 0x18 + *(long *)(in_FS_OFFSET + -0x1e8)),bytes);
      ptVar6->pending_reqs = ptVar6->pending_reqs + 1;
      bVar19.bytes = (uint64_t)(int)uVar16;
      bVar19.reqs = 1;
      add_throughput_tx_sample(bVar19);
      lVar10 = get_ia();
      lVar18 = lVar18 + lVar10;
    }
    uVar4 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1f8),__events,iVar1 / iVar2,0);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar14 = 0; iVar5 = lVar18, uVar14 != uVar4; uVar14 = uVar14 + 1) {
      ptVar6 = (tcp_connection *)
               ((long)*(int *)(&__events->field_0x4 + uVar14 * 0xc) * 0x400c +
               *(long *)(in_FS_OFFSET + -0x1f0));
      if (((&__events->events)[uVar14 * 3] & 1) == 0) {
        if (((&__events->events)[uVar14 * 3] & 8) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                        ,0x21e,"void symmetric_nic_tcp_main(void)");
        }
        get_tx_timestamp(ptVar6->fd,
                         (pending_tx_timestamps *)
                         ((ulong)ptVar6->idx * 0x18 + *(long *)(in_FS_OFFSET + -0x1e8)));
LAB_0010887a:
        iVar13 = time_ns();
        if (lVar18 < iVar13) break;
      }
      else {
        sVar11 = timestamp_recv(ptVar6->fd,ptVar6->buffer + ptVar6->buffer_idx,
                                0x4000 - (ulong)ptVar6->buffer_idx,0,&rx_timestamp);
        if ((int)sVar11 < 0) {
          piVar9 = __errno_location();
          if (*piVar9 != 0xb) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            __s = "Unknown connection error read\n";
            goto LAB_001088ca;
          }
LAB_00108783:
          ptVar6->buffer_idx = ptVar6->buffer_idx + (short)sVar11;
          bVar19 = handle_response(ptVar6);
          if (bVar19.reqs != 0) {
            ptVar6->pending_reqs = ptVar6->pending_reqs - (short)bVar19.reqs;
            for (uVar17 = 0; uVar17 != bVar19.reqs; uVar17 = uVar17 + 1) {
              unaff_RBP = pop_pending_tx_timestamps
                                    ((pending_tx_timestamps *)
                                     ((ulong)ptVar6->idx * 0x18 + *(long *)(in_FS_OFFSET + -0x1e8)))
              ;
              if (unaff_RBP == (timestamp_info *)0x0) {
                do {
                  iVar3 = get_tx_timestamp(ptVar6->fd,
                                           (pending_tx_timestamps *)
                                           ((ulong)ptVar6->idx * 0x18 +
                                           *(long *)(in_FS_OFFSET + -0x1e8)));
                } while (iVar3 != 1);
                lVar10 = *(long *)(in_FS_OFFSET + -0x1e8);
                lVar12 = (ulong)ptVar6->idx * 0x18;
                if (*(uint *)(lVar10 + 8 + lVar12) <= *(uint *)(lVar10 + 0xc + lVar12)) {
                  __assert_fail("per_conn_tx_timestamps[conn->idx].consumed < per_conn_tx_timestamps[conn->idx].tail"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                ,0x20c,"void symmetric_nic_tcp_main(void)");
                }
                unaff_RBP = pop_pending_tx_timestamps((pending_tx_timestamps *)(lVar10 + lVar12));
                if (unaff_RBP == (timestamp_info *)0x0) {
                  __assert_fail("tx_timestamp",
                                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                ,0x20f,"void symmetric_nic_tcp_main(void)");
                }
              }
            }
            iVar3 = timespec_diff(&latency,&rx_timestamp.time,&unaff_RBP->time);
            if (iVar3 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                            ,0x214,"void symmetric_nic_tcp_main(void)");
            }
            add_latency_sample((long)((double)latency.tv_sec * 1000000000.0 +
                                     (double)latency.tv_nsec),&unaff_RBP->time);
            add_throughput_rx_sample(bVar19);
            goto LAB_0010887a;
          }
        }
        else {
          if ((int)sVar11 != 0) goto LAB_00108783;
          close(ptVar6->fd);
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          fwrite("Connection closed\n",0x12,1,_stderr);
          ptVar6->closed = 1;
        }
      }
    }
  } while( true );
}

Assistant:

static void symmetric_nic_tcp_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timestamp_info rx_timestamp, *tx_timestamp;
	struct msghdr hdr;
	struct timespec latency;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;

			to_send = prepare_request();
			// send once
			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			bzero(&hdr, sizeof(hdr));
			hdr.msg_iov = to_send->iovs;
			hdr.msg_iovlen = to_send->iov_cnt;

			ret = sendmsg(conn->fd, &hdr, 0);
			if ((ret < 0) && (errno != EWOULDBLOCK)) {
				lancet_perror("Unknown connection error write\n");
				return;
			}
			assert(ret == bytes_to_send);
			add_pending_tx_timestamp(&per_conn_tx_timestamps[conn->idx],
									 bytes_to_send);
			conn->pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = timestamp_recv(conn->fd, &conn->buffer[conn->buffer_idx],
									 MAX_PAYLOAD - conn->buffer_idx, 0,
									 &rx_timestamp);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;
				read_res = handle_response(conn);
				if (read_res.reqs == 0) {
					continue;
				}

				// assert(read_res.reqs >= 1);
				// no need for assert because it must be true based on data type
				conn->pending_reqs -= read_res.reqs;
				assert(conn->pending_reqs >= 0);

				/*
				 * Assume only the last request will have an rx timestamp!
				 */
				for (j = 0; j < read_res.reqs; j++) {
					tx_timestamp = pop_pending_tx_timestamps(
						&per_conn_tx_timestamps[conn->idx]);
					if (!tx_timestamp) {
						ret = get_tx_timestamp(
							conn->fd, &per_conn_tx_timestamps[conn->idx]);
						while (ret != 1)
							ret = get_tx_timestamp(
								conn->fd, &per_conn_tx_timestamps[conn->idx]);
						assert(ret == 1);
						assert(per_conn_tx_timestamps[conn->idx].consumed <
							   per_conn_tx_timestamps[conn->idx].tail);
						tx_timestamp = pop_pending_tx_timestamps(
							&per_conn_tx_timestamps[conn->idx]);
						assert(tx_timestamp);
					}
				}
				ret = timespec_diff(&latency, &rx_timestamp.time,
									&tx_timestamp->time);
				assert(ret == 0);
				long diff = latency.tv_nsec + latency.tv_sec * 1e9;
				add_latency_sample(diff, &tx_timestamp->time);

				/* Bookkeeping */
				add_throughput_rx_sample(read_res);
			} else if (events[i].events & EPOLLERR) {
				/* Get tx timetamps */
				get_tx_timestamp(conn->fd, &per_conn_tx_timestamps[conn->idx]);
			} else
				assert(0);

			if ((time_ns() - next_tx) > 0)
				break;
		}
	}
}